

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void Log::record_log(void)

{
  bool bVar1;
  time_t __val;
  ostream *poVar2;
  reference pbVar3;
  string local_290 [8];
  string element;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ostream local_208 [8];
  ofstream log;
  
  std::ofstream::ofstream(local_208);
  std::ofstream::open(local_208,"LogFile.txt",0x10);
  __val = time((time_t *)0x0);
  std::__cxx11::to_string((string *)&__range1,__val);
  std::operator+(&local_238,"Log Data for ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  poVar2 = std::operator<<(local_208,(string *)&local_238);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&records_abi_cxx11_);
  element.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&records_abi_cxx11_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&element.field_2 + 8));
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_290,(string *)pbVar3);
    std::operator<<(local_208,local_290);
    std::operator<<(local_208,"\n-----------------------------------------------\n");
    std::__cxx11::string::~string(local_290);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void Log::record_log() {
    std::ofstream log = std::ofstream();
    log.open("LogFile.txt");
    log << "Log Data for " + std::to_string(time(0)) << "\n\n";
    for (std::string element : Log::records) {
        log << element;
        log << "\n-----------------------------------------------\n";
    }
    log.close();
}